

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O1

int __thiscall
ncnn::InnerProduct_x86::forward_fp16s
          (InnerProduct_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  long lVar6;
  int iVar7;
  Option opt_flatten;
  void *local_b8;
  undefined4 uStack_b0;
  undefined4 uStack_ac;
  undefined4 local_a8;
  undefined4 uStack_a4;
  int local_a0;
  Allocator *local_98;
  int local_90;
  undefined4 uStack_8c;
  undefined4 uStack_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  size_t local_78;
  undefined4 local_68;
  int iStack_64;
  Allocator *pAStack_60;
  undefined4 local_58;
  undefined4 uStack_54;
  int iStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  int local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  local_90 = bottom_blob->dims;
  if ((local_90 == 2) &&
     (bottom_blob->w ==
      *(int *)(&this->field_0xd8 + (long)this->_vptr_InnerProduct_x86[-3]) /
      *(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]))) {
    if (1 < bottom_blob->elempack * bottom_blob->h) {
      Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]),
                  bottom_blob->h,bottom_blob->elemsize,bottom_blob->elempack,opt->blob_allocator);
      if (top_blob->data == (void *)0x0) {
        return -100;
      }
      if ((long)top_blob->c * top_blob->cstep == 0) {
        return -100;
      }
      return 0;
    }
  }
  local_b8 = bottom_blob->data;
  piVar1 = bottom_blob->refcount;
  uStack_b0 = SUB84(piVar1,0);
  uStack_ac = (undefined4)((ulong)piVar1 >> 0x20);
  local_a8 = (undefined4)bottom_blob->elemsize;
  uStack_a4 = (undefined4)(bottom_blob->elemsize >> 0x20);
  local_a0 = bottom_blob->elempack;
  local_98 = bottom_blob->allocator;
  uVar2 = bottom_blob->w;
  uVar3 = bottom_blob->h;
  uVar4 = bottom_blob->d;
  uVar5 = bottom_blob->c;
  local_78 = bottom_blob->cstep;
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + 1;
    UNLOCK();
  }
  uStack_8c = uVar2;
  uStack_88 = uVar3;
  uStack_84 = uVar4;
  uStack_80 = uVar5;
  if (bottom_blob->dims != 1) {
    local_68 = *(undefined4 *)opt;
    iStack_64 = opt->num_threads;
    local_58 = *(undefined4 *)&opt->workspace_allocator;
    uStack_54 = *(undefined4 *)((long)&opt->workspace_allocator + 4);
    iStack_50 = opt->openmp_blocktime;
    uStack_4c._0_1_ = opt->use_winograd_convolution;
    uStack_4c._1_1_ = opt->use_sgemm_convolution;
    uStack_4c._2_1_ = opt->use_int8_inference;
    uStack_4c._3_1_ = opt->use_vulkan_compute;
    local_48._0_1_ = opt->use_bf16_storage;
    local_48._1_1_ = opt->use_fp16_packed;
    local_48._2_1_ = opt->use_fp16_storage;
    local_48._3_1_ = opt->use_fp16_arithmetic;
    uStack_44._0_1_ = opt->use_int8_packed;
    uStack_44._1_1_ = opt->use_int8_storage;
    uStack_44._2_1_ = opt->use_int8_arithmetic;
    uStack_44._3_1_ = opt->use_packing_layout;
    uStack_40._0_1_ = opt->use_shader_pack8;
    uStack_40._1_1_ = opt->use_subgroup_basic;
    uStack_40._2_1_ = opt->use_subgroup_vote;
    uStack_40._3_1_ = opt->use_subgroup_ballot;
    uStack_3c._0_1_ = opt->use_subgroup_shuffle;
    uStack_3c._1_1_ = opt->use_image_storage;
    uStack_3c._2_1_ = opt->use_tensor_storage;
    uStack_3c._3_1_ = opt->use_reserved_0;
    local_38 = opt->flush_denormals;
    uStack_34._0_1_ = opt->use_local_pool_allocator;
    uStack_34._1_1_ = opt->use_shader_local_memory;
    uStack_34._2_1_ = opt->use_cooperative_matrix;
    uStack_34._3_1_ = opt->use_winograd23_convolution;
    uStack_30._0_1_ = opt->use_winograd43_convolution;
    uStack_30._1_1_ = opt->use_winograd63_convolution;
    uStack_30._2_1_ = opt->use_reserved_6;
    uStack_30._3_1_ = opt->use_reserved_7;
    uStack_2c._0_1_ = opt->use_reserved_8;
    uStack_2c._1_1_ = opt->use_reserved_9;
    uStack_2c._2_1_ = opt->use_reserved_10;
    uStack_2c._3_1_ = opt->use_reserved_11;
    pAStack_60 = opt->workspace_allocator;
    (*this->flatten->_vptr_Layer[7])(this->flatten,bottom_blob,&local_b8);
  }
  lVar6 = 1;
  if (opt->use_packing_layout == true) {
    lVar6 = 8;
    if ((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) & 7) != 0) {
      lVar6 = (ulong)((*(uint *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) & 3) ==
                     0) * 3 + 1;
    }
  }
  Mat::create(top_blob,*(int *)(&this->field_0xd0 + (long)this->_vptr_InnerProduct_x86[-3]) /
                       (int)lVar6,lVar6 * (CONCAT44(uStack_a4,local_a8) / (ulong)(long)local_a0),
              (int)lVar6,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    iVar7 = -100;
  }
  else {
    iVar7 = -100;
    if ((long)top_blob->c * top_blob->cstep != 0) {
      iVar7 = 0;
    }
  }
  piVar1 = (int *)CONCAT44(uStack_ac,uStack_b0);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      if (local_98 == (Allocator *)0x0) {
        if (local_b8 != (void *)0x0) {
          free(local_b8);
        }
      }
      else {
        (*local_98->_vptr_Allocator[3])();
      }
    }
  }
  return iVar7;
}

Assistant:

int InnerProduct_x86::forward_fp16s(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    const int num_input = weight_data_size / num_output;

    if (bottom_blob.dims == 2 && bottom_blob.w == num_input && bottom_blob.h * bottom_blob.elempack > 1)
    {
        // gemm
        int h = bottom_blob.h;
        size_t elemsize = bottom_blob.elemsize;
        int elempack = bottom_blob.elempack;

        top_blob.create(num_output, h, elemsize, elempack, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        innerproduct_gemm_fp16s_sse(bottom_blob, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);

        return 0;
    }

    // flatten
    Mat bottom_blob_flattened = bottom_blob;
    if (bottom_blob.dims != 1)
    {
        Option opt_flatten = opt;
        opt_flatten.blob_allocator = opt.workspace_allocator;

        flatten->forward(bottom_blob, bottom_blob_flattened, opt_flatten);
    }

    size_t elemsize = bottom_blob_flattened.elemsize;
    int elempack = bottom_blob_flattened.elempack;

    int out_elempack = 1;
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#endif
    }
    size_t out_elemsize = elemsize / elempack * out_elempack;

    top_blob.create(num_output / out_elempack, out_elemsize, out_elempack, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __AVX512F__
    if (out_elempack == 16)
    {
        innerproduct_fp16s_pack16_avx512(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }
#endif // __AVX512F__

    if (out_elempack == 8)
    {
        innerproduct_fp16s_pack8_avx(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 4)
    {
        innerproduct_fp16s_pack4_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    if (out_elempack == 1)
    {
        innerproduct_fp16s_sse(bottom_blob_flattened, top_blob, weight_data_tm, bias_data, activation_type, activation_params, opt);
    }

    return 0;
}